

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusFunction.hpp
# Opt level: O3

void __thiscall
OpenMD::DumpStatusFunction::writeStatus
          (DumpStatusFunction *this,int functionCount,int param_2,
          DynamicVector<double,_std::allocator<double>_> *param_3,RealType param_4)

{
  Snapshot::setTime(this->info_->sman_->currentSnapshot_,(double)functionCount);
  Stats::collectStats(this->stats);
  StatWriter::writeStat(this->statWriter);
  DumpWriter::writeDumpAndEor(this->dumpWriter);
  return;
}

Assistant:

virtual void writeStatus(int functionCount, int,
                             const DynamicVector<RealType>&, RealType) {
      Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
      curSnapshot->setTime(functionCount);
      stats->collectStats();
      statWriter->writeStat();

      dumpWriter->writeDumpAndEor();
    }